

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O3

void plutovg_font_face_get_glyph_metrics
               (plutovg_font_face_t *face,float size,plutovg_codepoint_t codepoint,
               float *advance_width,float *left_side_bearing,plutovg_rect_t *extents)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  glyph_t *pgVar6;
  float fVar7;
  
  uVar3 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
  fVar7 = size / (float)(ushort)(uVar3 << 8 | uVar3 >> 8);
  pgVar6 = plutovg_font_face_get_glyph(face,codepoint);
  if (advance_width != (float *)0x0) {
    *advance_width = (float)pgVar6->advance_width * fVar7;
  }
  if (left_side_bearing != (float *)0x0) {
    *left_side_bearing = (float)pgVar6->left_side_bearing * fVar7;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    uVar1 = pgVar6->y1;
    uVar2 = pgVar6->x2;
    iVar4 = pgVar6->x1;
    iVar5 = pgVar6->y2;
    extents->x = fVar7 * (float)iVar4;
    extents->y = -fVar7 * (float)iVar5;
    extents->w = fVar7 * (float)(uVar2 - iVar4);
    extents->h = -fVar7 * (float)(uVar1 - iVar5);
  }
  return;
}

Assistant:

void plutovg_font_face_get_glyph_metrics(plutovg_font_face_t* face, float size, plutovg_codepoint_t codepoint, float* advance_width, float* left_side_bearing, plutovg_rect_t* extents)
{
    float scale = plutovg_font_face_get_scale(face, size);
    glyph_t* glyph = plutovg_font_face_get_glyph(face, codepoint);
    if(advance_width) *advance_width = glyph->advance_width * scale;
    if(left_side_bearing) *left_side_bearing = glyph->left_side_bearing * scale;
    if(extents) {
        extents->x = glyph->x1 * scale;
        extents->y = glyph->y2 * -scale;
        extents->w = (glyph->x2 - glyph->x1) * scale;
        extents->h = (glyph->y1 - glyph->y2) * -scale;
    }
}